

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tui.cc
# Opt level: O0

void curses_interface_exec(_func_void_void_ptr *idle_proc,void *idle_data)

{
  time_point this;
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  duration local_1460;
  byte local_1449;
  TUI_windows local_1418;
  int local_1318;
  allocator local_1311;
  int key;
  allocator local_12e9;
  string local_12e8;
  duration<long,_std::ratio<1L,_1L>_> local_12c8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_12c0;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_12b8;
  time_point now;
  Player *player;
  time_point bank_check_last;
  uint bank_check_interval;
  IniProcessingVariant local_1278;
  IniProcessingVariant local_1250;
  string local_1228;
  allocator local_1201;
  string local_1200;
  char *local_11e0;
  char *path;
  char pathbuf [4097];
  uint timeout_ms;
  TUI_context ctx;
  Screen local_19;
  _func_void_void_ptr *p_Stack_18;
  Screen screen;
  void *idle_data_local;
  _func_void_void_ptr *idle_proc_local;
  
  p_Stack_18 = (_func_void_void_ptr *)idle_data;
  Screen::Screen(&local_19);
  Screen::init(&local_19,(EVP_PKEY_CTX *)idle_data);
  TUI_context::TUI_context((TUI_context *)(pathbuf + 0x1000));
  ctx.idle_proc = p_Stack_18;
  ctx.channel_state._8_8_ = idle_proc;
  bVar1 = has_colors();
  if ((bVar1 & 1) != 0) {
    setup_colors();
  }
  raw();
  keypad(_stdscr,1);
  noecho();
  pathbuf[0xffc] = '2';
  pathbuf[0xffd] = '\0';
  pathbuf[0xffe] = '\0';
  pathbuf[0xfff] = '\0';
  wtimeout(_stdscr,0x32);
  curs_set(0);
  set_escdelay(0x19);
  local_11e0 = getcwd((char *)&path,0x1001);
  if (local_11e0 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&ctx.player);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1200,"tui",&local_1201);
  IniProcessing::beginGroup(&configFile,&local_1200);
  std::__cxx11::string::~string((string *)&local_1200);
  std::allocator<char>::~allocator((allocator<char> *)&local_1201);
  IniProcessingVariant::IniProcessingVariant(&local_1278,(string *)&ctx.player);
  IniProcessing::value(&local_1250,&configFile,"bank_directory",&local_1278);
  IniProcessingVariant::toString_abi_cxx11_(&local_1228,&local_1250);
  std::__cxx11::string::operator=((string *)&ctx.player,(string *)&local_1228);
  std::__cxx11::string::~string((string *)&local_1228);
  IniProcessingVariant::~IniProcessingVariant(&local_1250);
  IniProcessingVariant::~IniProcessingVariant(&local_1278);
  IniProcessing::endGroup(&configFile);
  setup_display((TUI_context *)(pathbuf + 0x1000));
  pcVar3 = _("Ready!");
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&bank_check_interval,pcVar3,(allocator *)((long)&bank_check_last.__d.__r + 7)
            );
  show_status((TUI_context *)(pathbuf + 0x1000),(string *)&bank_check_interval,10);
  std::__cxx11::string::~string((string *)&bank_check_interval);
  std::allocator<char>::~allocator((allocator<char> *)((long)&bank_check_last.__d.__r + 7));
  bank_check_last.__d.__r._0_4_ = 1;
  player = (Player *)std::chrono::_V2::steady_clock::now();
  while( true ) {
    local_1449 = 0;
    if ((pathbuf[0x1000] & 1U) == 0) {
      bVar2 = interface_interrupted();
      local_1449 = bVar2 ^ 0xff;
    }
    if ((local_1449 & 1) == 0) break;
    if (idle_proc != (_func_void_void_ptr *)0x0) {
      (*idle_proc)(p_Stack_18);
    }
    handle_notifications((TUI_context *)(pathbuf + 0x1000));
    bVar2 = have_active_player();
    if (bVar2) {
      local_1460.__r = (rep)active_player();
    }
    else {
      local_1460.__r = 0;
    }
    now.__d.__r = (duration)(duration)local_1460.__r;
    if (ctx.status_start.__d.__r != (duration)local_1460.__r) {
      ctx.status_start.__d.__r = (duration)(duration)local_1460.__r;
      update_bank_mtime((TUI_context *)(pathbuf + 0x1000));
    }
    local_12b8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    local_12c0.__r =
         (rep)std::chrono::operator-
                        (&local_12b8,
                         (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&player);
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<unsigned_int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_12c8,(uint *)&bank_check_last);
    bVar2 = std::chrono::operator>(&local_12c0,&local_12c8);
    if (bVar2) {
      bVar2 = update_bank_mtime((TUI_context *)(pathbuf + 0x1000));
      this = ctx.status_start;
      if (bVar2) {
        active_bank_file_abi_cxx11_();
        pcVar3 = (char *)std::__cxx11::string::c_str();
        bVar2 = Player::dynamic_load_bank((Player *)this.__d.__r,pcVar3);
        if (bVar2) {
          pcVar3 = _("Bank has changed on disk. Reload!");
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_12e8,pcVar3,&local_12e9);
          show_status((TUI_context *)(pathbuf + 0x1000),&local_12e8,10);
          std::__cxx11::string::~string((string *)&local_12e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_12e9);
        }
        else {
          pcVar3 = _("Bank has changed on disk. Reloading failed.");
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&key,pcVar3,&local_1311);
          show_status((TUI_context *)(pathbuf + 0x1000),(string *)&key,10);
          std::__cxx11::string::~string((string *)&key);
          std::allocator<char>::~allocator((allocator<char> *)&local_1311);
        }
      }
      player = (Player *)local_12b8.__d.__r;
    }
    update_display((TUI_context *)(pathbuf + 0x1000));
    local_1318 = wgetch(_stdscr);
    bVar2 = handle_anylevel_key((TUI_context *)(pathbuf + 0x1000),local_1318);
    if (!bVar2) {
      handle_toplevel_key((TUI_context *)(pathbuf + 0x1000),local_1318);
    }
    doupdate();
  }
  local_1418.keydesc1._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.keydesc2._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.instrument[0xf]._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.status._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.instrument[0xd]._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.instrument[0xe]._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.instrument[0xb]._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.instrument[0xc]._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.instrument[9]._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.instrument[10]._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.instrument[7]._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.instrument[8]._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.instrument[5]._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.instrument[6]._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.instrument[3]._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.instrument[4]._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.instrument[1]._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.instrument[2]._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.volume[1]._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.instrument[0]._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.volumeratio._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.volume[0]._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.banktitle._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.chanalloc._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.chipcount._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.cpuratio._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.playertitle._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.emutitle._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.outer._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.inner._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1418.keydesc3._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  TUI_windows::TUI_windows(&local_1418);
  TUI_windows::operator=((TUI_windows *)&ctx,&local_1418);
  TUI_windows::~TUI_windows(&local_1418);
  Screen::end(&local_19);
  bVar2 = interface_interrupted();
  if (bVar2) {
    fprintf(_stderr,"Interrupted.\n");
  }
  TUI_context::~TUI_context((TUI_context *)(pathbuf + 0x1000));
  Screen::~Screen(&local_19);
  return;
}

Assistant:

void curses_interface_exec(void (*idle_proc)(void *), void *idle_data)
{
    Screen screen;
    screen.init();

    TUI_context ctx;
    ctx.idle_proc = idle_proc;
    ctx.idle_data = idle_data;
#if defined(PDCURSES)
    install_event_hook(ctx);
#endif

    if (has_colors())
        setup_colors();
    raw();
    keypad(stdscr, true);
    noecho();
#ifdef ADLJACK_GTK3
    const unsigned timeout_ms = 1;
#else
    const unsigned timeout_ms = 50;
#endif
    timeout(timeout_ms);
    curs_set(0);
#if !defined(PDCURSES)
    set_escdelay(25);
#endif

#if defined(PDCURSES)
    PDC_set_title(get_program_title().c_str());
#endif

    {
        char pathbuf[PATH_MAX + 1];
        if (char *path = getcwd(pathbuf, sizeof(pathbuf)))
            ctx.bank_directory.assign(path);
    }

    configFile.beginGroup("tui");
    ctx.bank_directory = configFile.value("bank_directory", ctx.bank_directory).toString();
    configFile.endGroup();

#ifdef ADLJACK_GTK3
    s_tray_icon = create_tray_icon();

    if (active_player().type() == Player_Type::OPL3) {
        gtk_status_icon_set_from_icon_name(s_tray_icon, "adljack");
    } else {
        gtk_status_icon_set_from_icon_name(s_tray_icon, "opnjack");
    }

    g_signal_connect(G_OBJECT(s_tray_icon), "popup-menu", G_CALLBACK(tray_icon_on_menu),  &ctx);
#endif

    setup_display(ctx);
    show_status(ctx, _("Ready!"));

    unsigned bank_check_interval = 1;
    stc::steady_clock::time_point bank_check_last = stc::steady_clock::now();

    while (!ctx.quit && !interface_interrupted()) {
        if (idle_proc)
            idle_proc(idle_data);

        handle_notifications(ctx);

        Player *player = have_active_player() ? &active_player() : nullptr;
        if (ctx.player != player) {
            ctx.player = player;
            update_bank_mtime(ctx);
        }

        stc::steady_clock::time_point now = stc::steady_clock::now();
        if (now - bank_check_last > stc::seconds(bank_check_interval)) {
            if (update_bank_mtime(ctx)) {
                if (ctx.player->dynamic_load_bank(active_bank_file().c_str()))
                    show_status(ctx, _("Bank has changed on disk. Reload!"));
                else
                    show_status(ctx, _("Bank has changed on disk. Reloading failed."));
            }
            bank_check_last = now;
        }

        update_display(ctx);

#ifdef ADLJACK_GTK3
        gtk_main_iteration_do(false);
#endif
        int key = getch();
        if (!handle_anylevel_key(ctx, key))
            handle_toplevel_key(ctx, key);
        doupdate();
    }
    ctx.win = TUI_windows();
    screen.end();

#ifdef ADLJACK_GTK3
    gtk_status_icon_set_visible(s_tray_icon, FALSE);
#endif

    if (interface_interrupted())
        fprintf(stderr, "Interrupted.\n");
}